

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O0

FixupPoint * __thiscall
Allocator::construct<InstructionRegVmFinalizeContext::FixupPoint>(Allocator *this,int count)

{
  int iVar1;
  undefined4 extraout_var;
  FixupPoint *local_38;
  void *tmp;
  int count_local;
  Allocator *this_local;
  FixupPoint *pFVar2;
  
  iVar1 = (*this->_vptr_Allocator[2])(this,(ulong)(count * 0x10 + 4));
  pFVar2 = (FixupPoint *)CONCAT44(extraout_var,iVar1);
  if ((long)count != 0) {
    local_38 = pFVar2;
    do {
      InstructionRegVmFinalizeContext::FixupPoint::FixupPoint(local_38);
      local_38 = local_38 + 1;
    } while (local_38 != pFVar2 + count);
  }
  return pFVar2;
}

Assistant:

T* construct(int count)
	{
		void *tmp = (void*)alloc(4 + count * sizeof(T));
		new(tmp) T[count];
		return (T*)tmp;
	}